

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::Triangle::computeUnitNormal(Vector3d *__return_storage_ptr__,Triangle *this)

{
  Vector3d *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint i;
  long lVar7;
  double tmp;
  double dVar8;
  
  this->HaveUnitNormal_ = true;
  dVar8 = (this->b_).super_Vector<double,_3U>.data_[0];
  dVar2 = (this->a_).super_Vector<double,_3U>.data_[0];
  pVVar1 = &this->unitnormal_;
  dVar3 = (this->a_).super_Vector<double,_3U>.data_[1];
  dVar4 = (this->a_).super_Vector<double,_3U>.data_[2];
  dVar5 = (this->b_).super_Vector<double,_3U>.data_[1];
  dVar6 = (this->b_).super_Vector<double,_3U>.data_[2];
  (this->unitnormal_).super_Vector<double,_3U>.data_[0] = dVar6 * dVar3 - dVar4 * dVar5;
  (this->unitnormal_).super_Vector<double,_3U>.data_[1] = dVar8 * dVar4 - dVar2 * dVar6;
  (this->unitnormal_).super_Vector<double,_3U>.data_[2] = dVar2 * dVar5 - dVar3 * dVar8;
  dVar8 = 0.0;
  lVar7 = 0;
  do {
    dVar2 = (pVVar1->super_Vector<double,_3U>).data_[lVar7];
    dVar8 = dVar8 + dVar2 * dVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  lVar7 = 0;
  do {
    (pVVar1->super_Vector<double,_3U>).data_[lVar7] =
         (pVVar1->super_Vector<double,_3U>).data_[lVar7] / dVar8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  if (pVVar1 != __return_storage_ptr__) {
    (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] =
         (this->unitnormal_).super_Vector<double,_3U>.data_[2];
    dVar8 = (this->unitnormal_).super_Vector<double,_3U>.data_[1];
    (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] =
         (pVVar1->super_Vector<double,_3U>).data_[0];
    (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = dVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d Triangle::computeUnitNormal() {
  HaveUnitNormal_ = true;
  unitnormal_     = cross(a_, b_);
  unitnormal_.normalize();
  return unitnormal_;
}